

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O1

bool __thiscall ON_Sun::CImpl::SetLocalDateTime(CImpl *this,int year,int month,int day,double hours)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iValue;
  ulong uVar4;
  ON_XMLVariant local_118;
  
  uVar1 = 0x897;
  if (year < 0x897) {
    uVar1 = year;
  }
  uVar4 = 0x7b3;
  if (0x7b3 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  uVar1 = 0xc;
  if (month < 0xc) {
    uVar1 = month;
  }
  uVar3 = 1;
  if (1 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  iValue = (int)uVar4;
  if (((uVar4 & 3) != 0 || month != 2) ||
     ((iVar2 = 0x1d, ((uint)(iValue * -0x3d70a3d7) >> 2 | iValue * 0x40000000) < 0x28f5c29 &&
      (iValue != (int)(uVar4 / 400) * 400)))) {
    iVar2 = ON_SunEngine::DaysInMonth::tab[uVar3];
  }
  if (iVar2 < day) {
    day = iVar2;
  }
  iVar2 = 1;
  if (1 < day) {
    iVar2 = day;
  }
  ::ON_XMLVariant::ON_XMLVariant(&local_118,iValue);
  ON_InternalXMLImpl::SetParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",L"year"
             ,&local_118);
  ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  ::ON_XMLVariant::ON_XMLVariant(&local_118,(int)uVar3);
  ON_InternalXMLImpl::SetParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",
             L"month",&local_118);
  ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  ::ON_XMLVariant::ON_XMLVariant(&local_118,iVar2);
  ON_InternalXMLImpl::SetParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",L"day",
             &local_118);
  ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  ::ON_XMLVariant::ON_XMLVariant(&local_118,hours);
  ON_InternalXMLImpl::SetParameter
            (&this->super_ON_InternalXMLImpl,L"render-content-manager-document/settings/sun",L"time"
             ,&local_118);
  ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  this->_calc_dirty = true;
  return true;
}

Assistant:

bool ON_Sun::CImpl::SetLocalDateTime(int year, int month, int day, double hours)
{
  year  = std::max(MinYear(), std::min(MaxYear(), year));
  month = std::max(1, std::min(12, month));
  day   = std::max(1, std::min(ON_SunEngine::DaysInMonth(month, year), day));

  const wchar_t* s = XMLPath_Sun();
  SetParameter(s, ON_RDK_SUN_DATE_YEAR,  year);
  SetParameter(s, ON_RDK_SUN_DATE_MONTH, month);
  SetParameter(s, ON_RDK_SUN_DATE_DAY,   day);
  SetParameter(s, ON_RDK_SUN_TIME_HOURS, hours);

  _calc_dirty = true;

  return true;
}